

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O0

void __thiscall Configurator::~Configurator(Configurator *this)

{
  string *in_RDI;
  
  std::ostream::~ostream(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~Configurator() {}